

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitNumberOf
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,NumberOfExpr e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  iterator end;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> sep;
  ExprBase this_00;
  long in_RDI;
  iterator i;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_ffffffffffffff88;
  BasicStringRef<char> *this_01;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  *this_02;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [12];
  int in_stack_ffffffffffffffc4;
  ExprBase in_stack_ffffffffffffffe0;
  
  this_01 = *(BasicStringRef<char> **)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef(this_01,(char *)in_stack_ffffffffffffff88);
  value.size_._4_4_ = in_stack_ffffffffffffffc4;
  value._0_12_ = in_stack_ffffffffffffffb8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value);
  end = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
        ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                 *)in_stack_ffffffffffffff88);
  sep = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
                  ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                   &stack0xffffffffffffffd8,0);
  this_00.impl_ =
       (Impl *)internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
               operator*(in_stack_ffffffffffffff88);
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)end.ptr_,
        (NumericExpr)in_stack_ffffffffffffffe0.impl_,SUB84(this_00.impl_,4));
  this_02 = *(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              **)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef(this_01,(char *)in_stack_ffffffffffffff88);
  value_00.size_._4_4_ = in_stack_ffffffffffffffc4;
  value_00._0_12_ = in_stack_ffffffffffffffb8;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_00);
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  ::end(this_02);
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this_00.impl_,
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
             in_stack_ffffffffffffffe0.impl_,
             (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)end.ptr_,
             (char *)sep.ptr_,in_stack_ffffffffffffffc4);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitNumberOf(NumberOfExpr e) {
  writer_ << "numberof ";
  typename NumberOfExpr::iterator i = e.begin();
  Visit(*i++, prec::UNKNOWN);
  writer_ << " in ";
  WriteArgs(i, e.end());
}